

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# structurally_valid.cc
# Opt level: O0

int google::protobuf::internal::UTF8GenericScanFastAscii
              (UTF8ScanObj *st,char *str,int str_length,int *bytes_consumed)

{
  bool bVar1;
  uint8 *local_68;
  int local_58;
  int exit_reason;
  int rest_consumed;
  int n;
  uint8 *srclimit8;
  uint8 *srclimit;
  uint8 *src;
  uint8 *isrc;
  int *bytes_consumed_local;
  char *pcStack_20;
  int str_length_local;
  char *str_local;
  UTF8ScanObj *st_local;
  
  *bytes_consumed = 0;
  if (str_length == 0) {
    st_local._4_4_ = 0xf1;
  }
  else {
    srclimit8 = (uint8 *)(str + str_length);
    local_68 = (uint8 *)str;
    if (6 < str_length) {
      local_68 = srclimit8 + -7;
    }
    _rest_consumed = local_68;
    srclimit = (uint8 *)str;
    str_local = (char *)st;
    pcStack_20 = str;
    bytes_consumed_local._4_4_ = str_length;
    isrc = (uint8 *)bytes_consumed;
    src = (uint8 *)str;
    do {
      while( true ) {
        bVar1 = false;
        if ((((ulong)srclimit & 7) != 0) && (bVar1 = false, srclimit < srclimit8)) {
          bVar1 = *srclimit < 0x80;
        }
        if (!bVar1) break;
        srclimit = srclimit + 1;
      }
      if (((ulong)srclimit & 7) == 0) {
        while( true ) {
          bVar1 = false;
          if (srclimit < _rest_consumed) {
            bVar1 = ((*(uint *)srclimit | *(uint *)(srclimit + 4)) & 0x80808080) == 0;
          }
          if (!bVar1) break;
          srclimit = srclimit + 8;
        }
      }
      while( true ) {
        bVar1 = false;
        if (srclimit < srclimit8) {
          bVar1 = *srclimit < 0x80;
        }
        if (!bVar1) break;
        srclimit = srclimit + 1;
      }
      exit_reason = (int)srclimit - (int)src;
      st_local._4_4_ =
           UTF8GenericScan((UTF8ScanObj *)str_local,pcStack_20 + exit_reason,
                           bytes_consumed_local._4_4_ - exit_reason,&local_58);
      srclimit = srclimit + local_58;
    } while (st_local._4_4_ == 0xfd);
    *(int *)isrc = (int)srclimit - (int)src;
  }
  return st_local._4_4_;
}

Assistant:

int UTF8GenericScanFastAscii(const UTF8ScanObj* st,
                    const char * str,
                    int str_length,
                    int* bytes_consumed) {
  *bytes_consumed = 0;
  if (str_length == 0) return kExitOK;

  const uint8* isrc =  reinterpret_cast<const uint8*>(str);
  const uint8* src = isrc;
  const uint8* srclimit = isrc + str_length;
  const uint8* srclimit8 = str_length < 7 ? isrc : srclimit - 7;
  int n;
  int rest_consumed;
  int exit_reason;
  do {
    // Check initial few bytes one at a time until 8-byte aligned
    while ((((uintptr_t)src & 0x07) != 0) &&
           (src < srclimit) && (src[0] < 0x80)) {
      src++;
    }
    if (((uintptr_t)src & 0x07) == 0) {
      while ((src < srclimit8) &&
             (((reinterpret_cast<const uint32*>(src)[0] |
                reinterpret_cast<const uint32*>(src)[1]) & 0x80808080) == 0)) {
        src += 8;
      }
    }
    while ((src < srclimit) && (src[0] < 0x80)) {
      src++;
    }
    // Run state table on the rest
    n = src - isrc;
    exit_reason = UTF8GenericScan(st, str + n, str_length - n, &rest_consumed);
    src += rest_consumed;
  } while ( exit_reason == kExitDoAgain );

  *bytes_consumed = src - isrc;
  return exit_reason;
}